

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O3

int64_t av1_lowbd_pixel_proj_error_sse4_1
                  (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
                  int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int *xq,
                  sgr_params_type *params)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_XMM5 [16];
  short sVar24;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  if (params->r[0] < 1) {
    uVar7 = 4;
    flt0 = flt1;
    flt0_stride = flt1_stride;
    if (params->r[1] < 1) {
      iVar6 = 0;
      if (height < 1) {
        auVar12 = (undefined1  [16])0x0;
        lVar2 = 0;
      }
      else {
        lVar2 = 0;
        auVar12 = (undefined1  [16])0x0;
        do {
          uVar8 = 0;
          if (0xf < width) {
            lVar9 = 0;
            do {
              auVar15 = *(undefined1 (*) [16])(dat8 + lVar9);
              auVar17 = *(undefined1 (*) [16])(src8 + lVar9);
              auVar19 = pmovzxbw(in_XMM4,auVar15);
              in_XMM5 = pmovzxbw(in_XMM5,auVar17);
              auVar25._0_2_ = auVar19._0_2_ - in_XMM5._0_2_;
              auVar25._2_2_ = auVar19._2_2_ - in_XMM5._2_2_;
              auVar25._4_2_ = auVar19._4_2_ - in_XMM5._4_2_;
              auVar25._6_2_ = auVar19._6_2_ - in_XMM5._6_2_;
              auVar25._8_2_ = auVar19._8_2_ - in_XMM5._8_2_;
              auVar25._10_2_ = auVar19._10_2_ - in_XMM5._10_2_;
              auVar25._12_2_ = auVar19._12_2_ - in_XMM5._12_2_;
              auVar25._14_2_ = auVar19._14_2_ - in_XMM5._14_2_;
              auVar19._0_2_ = (ushort)auVar15[8] - (ushort)auVar17[8];
              auVar19._2_2_ = (ushort)auVar15[9] - (ushort)auVar17[9];
              auVar19._4_2_ = (ushort)auVar15[10] - (ushort)auVar17[10];
              auVar19._6_2_ = (ushort)auVar15[0xb] - (ushort)auVar17[0xb];
              auVar19._8_2_ = (ushort)auVar15[0xc] - (ushort)auVar17[0xc];
              auVar19._10_2_ = (ushort)auVar15[0xd] - (ushort)auVar17[0xd];
              auVar19._12_2_ = (ushort)auVar15[0xe] - (ushort)auVar17[0xe];
              auVar19._14_2_ = (ushort)auVar15[0xf] - (ushort)auVar17[0xf];
              auVar15 = pmaddwd(auVar25,auVar25);
              in_XMM4._0_4_ = auVar15._0_4_ + auVar12._0_4_;
              in_XMM4._4_4_ = auVar15._4_4_ + auVar12._4_4_;
              in_XMM4._8_4_ = auVar15._8_4_ + auVar12._8_4_;
              in_XMM4._12_4_ = auVar15._12_4_ + auVar12._12_4_;
              in_XMM2 = pmaddwd(auVar19,auVar19);
              auVar12._0_4_ = in_XMM2._0_4_ + in_XMM4._0_4_;
              auVar12._4_4_ = in_XMM2._4_4_ + in_XMM4._4_4_;
              auVar12._8_4_ = in_XMM2._8_4_ + in_XMM4._8_4_;
              auVar12._12_4_ = in_XMM2._12_4_ + in_XMM4._12_4_;
              lVar9 = lVar9 + 0x10;
              uVar8 = (width - 0x10U & 0xfffffff0) + 0x10;
            } while (lVar9 <= (int)(width - 0x10U));
          }
          if ((int)uVar8 < width) {
            uVar7 = (ulong)uVar8;
            do {
              lVar2 = lVar2 + ((ulong)dat8[uVar7] - (ulong)src8[uVar7]) *
                              ((ulong)dat8[uVar7] - (ulong)src8[uVar7]);
              uVar7 = uVar7 + 1;
            } while ((int)uVar7 < width);
          }
          dat8 = dat8 + dat_stride;
          src8 = src8 + src_stride;
          iVar6 = iVar6 + 1;
        } while (iVar6 != height);
      }
      auVar17 = pmovsxdq(in_XMM2,auVar12);
      auVar15._0_8_ = auVar12._8_8_;
      auVar15._8_4_ = auVar12._8_4_;
      auVar15._12_4_ = auVar12._12_4_;
      auVar12 = pmovsxdq(auVar15,auVar15);
      lVar9 = auVar12._0_8_ + auVar17._0_8_;
      lVar10 = auVar12._8_8_ + auVar17._8_8_;
      goto LAB_00427390;
    }
LAB_00427232:
    iVar6 = 0;
    if (0 < height) {
      uVar8 = *(uint *)((long)xq + uVar7);
      iVar3 = (uVar8 & 0xffff) + uVar8 * -0x100000;
      auVar17._4_4_ = iVar3;
      auVar17._0_4_ = iVar3;
      auVar17._8_4_ = iVar3;
      auVar17._12_4_ = iVar3;
      lVar9 = 0;
      lVar10 = 0;
      auVar12 = pmovsxwd(in_XMM2,0x400040004000400);
      lVar2 = 0;
      do {
        uVar7 = 0;
        auVar31 = (undefined1  [16])0x0;
        if (7 < width) {
          lVar4 = 0;
          auVar15 = auVar31;
          do {
            auVar19 = pmovzxbw(in_XMM4,*(undefined8 *)(dat8 + lVar4));
            in_XMM5 = pmovzxbw(in_XMM5,*(undefined8 *)(src8 + lVar4));
            auVar25 = packssdw(*(undefined1 (*) [16])(flt0 + lVar4),
                               *(undefined1 (*) [16])(flt0 + lVar4 + 4));
            auVar29._0_12_ = auVar25._0_12_;
            auVar29._12_2_ = auVar25._6_2_;
            auVar29._14_2_ = auVar19._6_2_;
            auVar28._12_4_ = auVar29._12_4_;
            auVar28._0_10_ = auVar25._0_10_;
            auVar28._10_2_ = auVar19._4_2_;
            auVar27._10_6_ = auVar28._10_6_;
            auVar27._0_8_ = auVar25._0_8_;
            auVar27._8_2_ = auVar25._4_2_;
            auVar26._8_8_ = auVar27._8_8_;
            auVar26._6_2_ = auVar19._2_2_;
            auVar26._4_2_ = auVar25._2_2_;
            auVar26._0_2_ = auVar25._0_2_;
            auVar26._2_2_ = auVar19._0_2_;
            auVar31 = pmaddwd(auVar26,auVar17);
            auVar22._2_2_ = auVar19._8_2_;
            auVar22._0_2_ = auVar25._8_2_;
            auVar22._4_2_ = auVar25._10_2_;
            auVar22._6_2_ = auVar19._10_2_;
            auVar22._8_2_ = auVar25._12_2_;
            auVar22._10_2_ = auVar19._12_2_;
            auVar22._12_2_ = auVar25._14_2_;
            auVar22._14_2_ = auVar19._14_2_;
            auVar25 = pmaddwd(auVar22,auVar17);
            auVar30._0_4_ = auVar31._0_4_ + auVar12._0_4_ >> 0xb;
            auVar30._4_4_ = auVar31._4_4_ + auVar12._4_4_ >> 0xb;
            auVar30._8_4_ = auVar31._8_4_ + auVar12._8_4_ >> 0xb;
            auVar30._12_4_ = auVar31._12_4_ + auVar12._12_4_ >> 0xb;
            auVar23._0_4_ = auVar25._0_4_ + auVar12._0_4_ >> 0xb;
            auVar23._4_4_ = auVar25._4_4_ + auVar12._4_4_ >> 0xb;
            auVar23._8_4_ = auVar25._8_4_ + auVar12._8_4_ >> 0xb;
            auVar23._12_4_ = auVar25._12_4_ + auVar12._12_4_ >> 0xb;
            auVar25 = packssdw(auVar30,auVar23);
            auVar33._0_2_ = (auVar19._0_2_ - in_XMM5._0_2_) + auVar25._0_2_;
            auVar33._2_2_ = (auVar19._2_2_ - in_XMM5._2_2_) + auVar25._2_2_;
            auVar33._4_2_ = (auVar19._4_2_ - in_XMM5._4_2_) + auVar25._4_2_;
            auVar33._6_2_ = (auVar19._6_2_ - in_XMM5._6_2_) + auVar25._6_2_;
            auVar33._8_2_ = (auVar19._8_2_ - in_XMM5._8_2_) + auVar25._8_2_;
            auVar33._10_2_ = (auVar19._10_2_ - in_XMM5._10_2_) + auVar25._10_2_;
            auVar33._12_2_ = (auVar19._12_2_ - in_XMM5._12_2_) + auVar25._12_2_;
            auVar33._14_2_ = (auVar19._14_2_ - in_XMM5._14_2_) + auVar25._14_2_;
            in_XMM4 = pmaddwd(auVar33,auVar33);
            auVar31._0_4_ = auVar15._0_4_ + in_XMM4._0_4_;
            auVar31._4_4_ = auVar15._4_4_ + in_XMM4._4_4_;
            auVar31._8_4_ = auVar15._8_4_ + in_XMM4._8_4_;
            auVar31._12_4_ = auVar15._12_4_ + in_XMM4._12_4_;
            lVar4 = lVar4 + 8;
            auVar15 = auVar31;
          } while (lVar4 <= (int)(width - 8U));
          uVar7 = (ulong)((width - 8U & 0xfffffff8) + 8);
        }
        iVar3 = (int)uVar7;
        while (iVar3 < width) {
          lVar4 = (long)(int)(((uint)dat8[uVar7] - (uint)src8[uVar7]) +
                             ((int)((flt0[uVar7] + (uint)dat8[uVar7] * -0x10) * uVar8 + 0x400) >>
                             0xb));
          lVar2 = lVar2 + lVar4 * lVar4;
          uVar7 = uVar7 + 1;
          iVar3 = (int)uVar7;
        }
        dat8 = dat8 + dat_stride;
        src8 = src8 + src_stride;
        in_XMM4 = pmovsxdq(in_XMM4,auVar31);
        auVar16._8_4_ = auVar31._8_4_;
        auVar16._12_4_ = auVar31._12_4_;
        auVar16._0_8_ = auVar31._8_8_;
        auVar15 = pmovsxdq(auVar16,auVar16);
        lVar9 = lVar9 + in_XMM4._0_8_ + auVar15._0_8_;
        lVar10 = lVar10 + in_XMM4._8_8_ + auVar15._8_8_;
        iVar6 = iVar6 + 1;
        flt0 = flt0 + flt0_stride;
      } while (iVar6 != height);
      goto LAB_00427390;
    }
  }
  else {
    uVar7 = 0;
    if (params->r[1] < 1) goto LAB_00427232;
    if (0 < height) {
      uVar8 = *xq & 0xffffU | xq[1] << 0x10;
      auVar11._4_4_ = uVar8;
      auVar11._0_4_ = uVar8;
      auVar11._8_4_ = uVar8;
      auVar11._12_4_ = uVar8;
      lVar9 = 0;
      lVar10 = 0;
      auVar12 = pmovsxwd(in_XMM2,0x400040004000400);
      lVar2 = 0;
      do {
        uVar5 = 0;
        auVar13 = (undefined1  [16])0x0;
        if (7 < width) {
          lVar4 = 0;
          auVar15 = auVar13;
          do {
            auVar17 = pmovzxbw(in_XMM4,*(undefined8 *)(dat8 + lVar4));
            in_XMM5 = pmovzxbw(in_XMM5,*(undefined8 *)(src8 + lVar4));
            auVar19 = packssdw(*(undefined1 (*) [16])(flt0 + lVar4),
                               *(undefined1 (*) [16])(flt0 + lVar4 + 4));
            auVar25 = packssdw(*(undefined1 (*) [16])(flt1 + lVar4),
                               *(undefined1 (*) [16])(flt1 + lVar4 + 4));
            auVar31 = psllw(auVar17,4);
            sVar24 = auVar19._6_2_ - auVar31._6_2_;
            auVar32._8_8_ =
                 (undefined8)
                 (CONCAT64(CONCAT42(CONCAT22(auVar25._6_2_ - auVar31._6_2_,sVar24),
                                    auVar25._4_2_ - auVar31._4_2_),
                           CONCAT22(auVar19._4_2_ - auVar31._4_2_,sVar24)) >> 0x10);
            auVar32._6_2_ = auVar25._2_2_ - auVar31._2_2_;
            auVar32._4_2_ = auVar19._2_2_ - auVar31._2_2_;
            auVar32._2_2_ = auVar25._0_2_ - auVar31._0_2_;
            auVar32._0_2_ = auVar19._0_2_ - auVar31._0_2_;
            auVar33 = pmaddwd(auVar32,auVar11);
            auVar20._2_2_ = auVar25._8_2_ - auVar31._8_2_;
            auVar20._0_2_ = auVar19._8_2_ - auVar31._8_2_;
            auVar20._4_2_ = auVar19._10_2_ - auVar31._10_2_;
            auVar20._6_2_ = auVar25._10_2_ - auVar31._10_2_;
            auVar20._8_2_ = auVar19._12_2_ - auVar31._12_2_;
            auVar20._10_2_ = auVar25._12_2_ - auVar31._12_2_;
            auVar20._12_2_ = auVar19._14_2_ - auVar31._14_2_;
            auVar20._14_2_ = auVar25._14_2_ - auVar31._14_2_;
            auVar19 = pmaddwd(auVar20,auVar11);
            auVar34._0_4_ = auVar33._0_4_ + auVar12._0_4_ >> 0xb;
            auVar34._4_4_ = auVar33._4_4_ + auVar12._4_4_ >> 0xb;
            auVar34._8_4_ = auVar33._8_4_ + auVar12._8_4_ >> 0xb;
            auVar34._12_4_ = auVar33._12_4_ + auVar12._12_4_ >> 0xb;
            auVar21._0_4_ = auVar19._0_4_ + auVar12._0_4_ >> 0xb;
            auVar21._4_4_ = auVar19._4_4_ + auVar12._4_4_ >> 0xb;
            auVar21._8_4_ = auVar19._8_4_ + auVar12._8_4_ >> 0xb;
            auVar21._12_4_ = auVar19._12_4_ + auVar12._12_4_ >> 0xb;
            auVar19 = packssdw(auVar34,auVar21);
            auVar18._0_2_ = (auVar17._0_2_ - in_XMM5._0_2_) + auVar19._0_2_;
            auVar18._2_2_ = (auVar17._2_2_ - in_XMM5._2_2_) + auVar19._2_2_;
            auVar18._4_2_ = (auVar17._4_2_ - in_XMM5._4_2_) + auVar19._4_2_;
            auVar18._6_2_ = (auVar17._6_2_ - in_XMM5._6_2_) + auVar19._6_2_;
            auVar18._8_2_ = (auVar17._8_2_ - in_XMM5._8_2_) + auVar19._8_2_;
            auVar18._10_2_ = (auVar17._10_2_ - in_XMM5._10_2_) + auVar19._10_2_;
            auVar18._12_2_ = (auVar17._12_2_ - in_XMM5._12_2_) + auVar19._12_2_;
            auVar18._14_2_ = (auVar17._14_2_ - in_XMM5._14_2_) + auVar19._14_2_;
            in_XMM4 = pmaddwd(auVar18,auVar18);
            auVar13._0_4_ = auVar15._0_4_ + in_XMM4._0_4_;
            auVar13._4_4_ = auVar15._4_4_ + in_XMM4._4_4_;
            auVar13._8_4_ = auVar15._8_4_ + in_XMM4._8_4_;
            auVar13._12_4_ = auVar15._12_4_ + in_XMM4._12_4_;
            lVar4 = lVar4 + 8;
            auVar15 = auVar13;
          } while (lVar4 <= (int)(width - 8U));
          uVar5 = (ulong)((width - 8U & 0xfffffff8) + 8);
        }
        iVar6 = (int)uVar5;
        while (iVar6 < width) {
          bVar1 = dat8[uVar5];
          lVar4 = (long)(int)(((uint)bVar1 - (uint)src8[uVar5]) +
                             ((int)((flt1[uVar5] + (uint)bVar1 * -0x10) * xq[1] +
                                    (flt0[uVar5] + (uint)bVar1 * -0x10) * *xq + 0x400) >> 0xb));
          lVar2 = lVar2 + lVar4 * lVar4;
          uVar5 = uVar5 + 1;
          iVar6 = (int)uVar5;
        }
        dat8 = dat8 + dat_stride;
        src8 = src8 + src_stride;
        in_XMM4 = pmovsxdq(in_XMM4,auVar13);
        auVar14._8_4_ = auVar13._8_4_;
        auVar14._12_4_ = auVar13._12_4_;
        auVar14._0_8_ = auVar13._8_8_;
        auVar15 = pmovsxdq(auVar14,auVar14);
        lVar9 = lVar9 + in_XMM4._0_8_ + auVar15._0_8_;
        lVar10 = lVar10 + in_XMM4._8_8_ + auVar15._8_8_;
        uVar8 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar8;
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
      } while (uVar8 != height);
      goto LAB_00427390;
    }
  }
  lVar9 = 0;
  lVar10 = 0;
  lVar2 = 0;
LAB_00427390:
  return lVar10 + lVar9 + lVar2;
}

Assistant:

int64_t av1_lowbd_pixel_proj_error_sse4_1(
    const uint8_t *src8, int width, int height, int src_stride,
    const uint8_t *dat8, int dat_stride, int32_t *flt0, int flt0_stride,
    int32_t *flt1, int flt1_stride, int xq[2], const sgr_params_type *params) {
  int i, j, k;
  const int32_t shift = SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS;
  const __m128i rounding = _mm_set1_epi32(1 << (shift - 1));
  __m128i sum64 = _mm_setzero_si128();
  const uint8_t *src = src8;
  const uint8_t *dat = dat8;
  int64_t err = 0;
  if (params->r[0] > 0 && params->r[1] > 0) {
    __m128i xq_coeff = pair_set_epi16(xq[0], xq[1]);
    for (i = 0; i < height; ++i) {
      __m128i sum32 = _mm_setzero_si128();
      for (j = 0; j <= width - 8; j += 8) {
        const __m128i d0 = _mm_cvtepu8_epi16(xx_loadl_64(dat + j));
        const __m128i s0 = _mm_cvtepu8_epi16(xx_loadl_64(src + j));
        const __m128i flt0_16b =
            _mm_packs_epi32(xx_loadu_128(flt0 + j), xx_loadu_128(flt0 + j + 4));
        const __m128i flt1_16b =
            _mm_packs_epi32(xx_loadu_128(flt1 + j), xx_loadu_128(flt1 + j + 4));
        const __m128i u0 = _mm_slli_epi16(d0, SGRPROJ_RST_BITS);
        const __m128i flt0_0_sub_u = _mm_sub_epi16(flt0_16b, u0);
        const __m128i flt1_0_sub_u = _mm_sub_epi16(flt1_16b, u0);
        const __m128i v0 = _mm_madd_epi16(
            xq_coeff, _mm_unpacklo_epi16(flt0_0_sub_u, flt1_0_sub_u));
        const __m128i v1 = _mm_madd_epi16(
            xq_coeff, _mm_unpackhi_epi16(flt0_0_sub_u, flt1_0_sub_u));
        const __m128i vr0 = _mm_srai_epi32(_mm_add_epi32(v0, rounding), shift);
        const __m128i vr1 = _mm_srai_epi32(_mm_add_epi32(v1, rounding), shift);
        const __m128i e0 =
            _mm_sub_epi16(_mm_add_epi16(_mm_packs_epi32(vr0, vr1), d0), s0);
        const __m128i err0 = _mm_madd_epi16(e0, e0);
        sum32 = _mm_add_epi32(sum32, err0);
      }
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq[0] * (flt0[k] - u) + xq[1] * (flt1[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt0 += flt0_stride;
      flt1 += flt1_stride;
      const __m128i sum64_0 = _mm_cvtepi32_epi64(sum32);
      const __m128i sum64_1 = _mm_cvtepi32_epi64(_mm_srli_si128(sum32, 8));
      sum64 = _mm_add_epi64(sum64, sum64_0);
      sum64 = _mm_add_epi64(sum64, sum64_1);
    }
  } else if (params->r[0] > 0 || params->r[1] > 0) {
    const int xq_active = (params->r[0] > 0) ? xq[0] : xq[1];
    const __m128i xq_coeff =
        pair_set_epi16(xq_active, -xq_active * (1 << SGRPROJ_RST_BITS));
    const int32_t *flt = (params->r[0] > 0) ? flt0 : flt1;
    const int flt_stride = (params->r[0] > 0) ? flt0_stride : flt1_stride;
    for (i = 0; i < height; ++i) {
      __m128i sum32 = _mm_setzero_si128();
      for (j = 0; j <= width - 8; j += 8) {
        const __m128i d0 = _mm_cvtepu8_epi16(xx_loadl_64(dat + j));
        const __m128i s0 = _mm_cvtepu8_epi16(xx_loadl_64(src + j));
        const __m128i flt_16b =
            _mm_packs_epi32(xx_loadu_128(flt + j), xx_loadu_128(flt + j + 4));
        const __m128i v0 =
            _mm_madd_epi16(xq_coeff, _mm_unpacklo_epi16(flt_16b, d0));
        const __m128i v1 =
            _mm_madd_epi16(xq_coeff, _mm_unpackhi_epi16(flt_16b, d0));
        const __m128i vr0 = _mm_srai_epi32(_mm_add_epi32(v0, rounding), shift);
        const __m128i vr1 = _mm_srai_epi32(_mm_add_epi32(v1, rounding), shift);
        const __m128i e0 =
            _mm_sub_epi16(_mm_add_epi16(_mm_packs_epi32(vr0, vr1), d0), s0);
        const __m128i err0 = _mm_madd_epi16(e0, e0);
        sum32 = _mm_add_epi32(sum32, err0);
      }
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq_active * (flt[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt += flt_stride;
      const __m128i sum64_0 = _mm_cvtepi32_epi64(sum32);
      const __m128i sum64_1 = _mm_cvtepi32_epi64(_mm_srli_si128(sum32, 8));
      sum64 = _mm_add_epi64(sum64, sum64_0);
      sum64 = _mm_add_epi64(sum64, sum64_1);
    }
  } else {
    __m128i sum32 = _mm_setzero_si128();
    for (i = 0; i < height; ++i) {
      for (j = 0; j <= width - 16; j += 16) {
        const __m128i d = xx_loadu_128(dat + j);
        const __m128i s = xx_loadu_128(src + j);
        const __m128i d0 = _mm_cvtepu8_epi16(d);
        const __m128i d1 = _mm_cvtepu8_epi16(_mm_srli_si128(d, 8));
        const __m128i s0 = _mm_cvtepu8_epi16(s);
        const __m128i s1 = _mm_cvtepu8_epi16(_mm_srli_si128(s, 8));
        const __m128i diff0 = _mm_sub_epi16(d0, s0);
        const __m128i diff1 = _mm_sub_epi16(d1, s1);
        const __m128i err0 = _mm_madd_epi16(diff0, diff0);
        const __m128i err1 = _mm_madd_epi16(diff1, diff1);
        sum32 = _mm_add_epi32(sum32, err0);
        sum32 = _mm_add_epi32(sum32, err1);
      }
      for (k = j; k < width; ++k) {
        const int32_t e = (int32_t)(dat[k]) - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
    }
    const __m128i sum64_0 = _mm_cvtepi32_epi64(sum32);
    const __m128i sum64_1 = _mm_cvtepi32_epi64(_mm_srli_si128(sum32, 8));
    sum64 = _mm_add_epi64(sum64_0, sum64_1);
  }
  int64_t sum[2];
  xx_storeu_128(sum, sum64);
  err += sum[0] + sum[1];
  return err;
}